

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O2

void __thiscall RenX_RelayPlugin::RenX_OnServerFullyConnected(RenX_RelayPlugin *this,Server *server)

{
  upstream_settings *puVar1;
  TCPSocket *pTVar2;
  char cVar3;
  mapped_type *this_00;
  reference pvVar4;
  TCPSocket *this_01;
  pointer puVar5;
  upstream_settings *settings;
  upstream_settings *puVar6;
  pointer in_server_info;
  Server *local_38;
  
  local_38 = server;
  this_00 = std::__detail::
            _Map_base<RenX::Server_*,_std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_std::allocator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>_>,_std::__detail::_Select1st,_std::equal_to<RenX::Server_*>,_std::hash<RenX::Server_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<RenX::Server_*,_std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_std::allocator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>_>,_std::__detail::_Select1st,_std::equal_to<RenX::Server_*>,_std::hash<RenX::Server_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->m_server_info_map,&local_38);
  in_server_info =
       (this_00->
       super__Vector_base<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
       )._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this_00->
           super__Vector_base<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (in_server_info == puVar5) {
    puVar1 = (this->m_configured_upstreams).
             super__Vector_base<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (this->m_configured_upstreams).
                  super__Vector_base<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
    {
      pvVar4 = std::
               vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
               ::emplace_back<>(this_00);
      pvVar4->m_settings = puVar6;
    }
    in_server_info =
         (this_00->
         super__Vector_base<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
         )._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this_00->
             super__Vector_base<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; in_server_info != puVar5; in_server_info = in_server_info + 1) {
    if (in_server_info->m_connected == false) {
      this_01 = (TCPSocket *)operator_new(0x10);
      Jupiter::TCPSocket::TCPSocket(this_01);
      pTVar2 = (in_server_info->m_socket)._M_t.
               super___uniq_ptr_impl<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>.
               _M_t.
               super__Tuple_impl<0UL,_Jupiter::TCPSocket_*,_std::default_delete<Jupiter::TCPSocket>_>
               .super__Head_base<0UL,_Jupiter::TCPSocket_*,_false>._M_head_impl;
      (in_server_info->m_socket)._M_t.
      super___uniq_ptr_impl<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>._M_t.
      super__Tuple_impl<0UL,_Jupiter::TCPSocket_*,_std::default_delete<Jupiter::TCPSocket>_>.
      super__Head_base<0UL,_Jupiter::TCPSocket_*,_false>._M_head_impl = this_01;
      if (pTVar2 != (TCPSocket *)0x0) {
        (**(code **)(*(long *)pTVar2 + 0x70))();
        this_01 = (in_server_info->m_socket)._M_t.
                  super___uniq_ptr_impl<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Jupiter::TCPSocket_*,_std::default_delete<Jupiter::TCPSocket>_>
                  .super__Head_base<0UL,_Jupiter::TCPSocket_*,_false>._M_head_impl;
      }
      cVar3 = (**(code **)(*(long *)this_01 + 8))
                        (this_01,(in_server_info->m_settings->m_upstream_hostname)._M_dataplus._M_p,
                         in_server_info->m_settings->m_upstream_port,0,0);
      if (cVar3 != '\0') {
        upstream_connected(this,server,in_server_info);
      }
    }
  }
  return;
}

Assistant:

void RenX_RelayPlugin::RenX_OnServerFullyConnected(RenX::Server &server) {
	auto& server_infos = m_server_info_map[&server];
	if (server_infos.empty()) {
		for (const auto& settings : m_configured_upstreams) {
			server_infos.emplace_back().m_settings = &settings;
		}
	}

	for (auto& server_info : server_infos) {
		if (!server_info.m_connected) {
			server_info.m_socket = std::unique_ptr<Jupiter::TCPSocket>(new Jupiter::TCPSocket());
			if (server_info.m_socket->connect(server_info.m_settings->m_upstream_hostname.c_str(), server_info.m_settings->m_upstream_port)) {
				upstream_connected(server, server_info);
			}
		}
	}
}